

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzer.cpp
# Opt level: O0

void __thiscall SWDAnalyzer::SWDAnalyzer(SWDAnalyzer *this)

{
  SWDAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__SWDAnalyzer_00120c98;
  SWDAnalyzerSettings::SWDAnalyzerSettings(&this->mSettings);
  std::auto_ptr<SWDAnalyzerResults>::auto_ptr(&this->mResults,(element_type *)0x0);
  SWDSimulationDataGenerator::SWDSimulationDataGenerator(&this->mSimulationDataGenerator);
  SWDParser::SWDParser(&this->mSWDParser);
  this->mSimulationInitilized = false;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

SWDAnalyzer::SWDAnalyzer() : mSimulationInitilized( false )
{
    SetAnalyzerSettings( &mSettings );
}